

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  size_t sVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  char *lhs_expression;
  char *rhs_expression;
  AssertHelper *this_00;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__3;
  StringIO stringio;
  string stringbuf;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char contents [24];
  AssertionResult gtest_ar;
  size_t num_bytes;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FILE *fp;
  string kExpectedSparse;
  string kExpectedDense;
  TypeParam ht_out;
  bool *in_stack_fffffffffffffb48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  allocator_type *in_stack_fffffffffffffb60;
  key_equal *in_stack_fffffffffffffb68;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  size_type in_stack_fffffffffffffb78;
  Type TVar5;
  string *s;
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  char *in_stack_fffffffffffffbb8;
  char *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbcc;
  AssertHelper *in_stack_fffffffffffffbd0;
  AssertionResult local_3b8 [2];
  AssertionResult local_398;
  string local_388 [55];
  undefined1 local_351;
  AssertionResult local_350;
  StringIO local_340;
  string local_338;
  allocator local_301;
  string local_300 [32];
  AssertionResult local_2e0 [2];
  allocator local_2b9;
  string local_2b8 [32];
  AssertionResult local_298 [2];
  int local_278;
  undefined4 local_274;
  AssertionResult local_270 [2];
  size_t local_250;
  AssertionResult local_248;
  char local_238 [40];
  undefined8 local_210;
  AssertionResult local_208;
  size_t local_1f8;
  string local_1f0 [55];
  undefined1 local_1b9;
  AssertionResult local_1b8;
  string local_1a8 [55];
  undefined1 local_171;
  AssertionResult local_170;
  string local_160 [55];
  undefined1 local_129;
  AssertionResult local_128;
  FILE *local_118;
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [48];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b0;
  Hasher local_a0;
  Hasher local_94;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_88;
  
  Hasher::Hasher(&local_94,0);
  Hasher::Hasher(&local_a0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_b0,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
             (hasher *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  TVar5 = (Type)(in_stack_fffffffffffffb78 >> 0x20);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,anon_var_dwarf_14da82,0x18,&local_e1);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"$hu1",0x14,&local_109);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  bVar2 = google::
          HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_readwrite
                    ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)&local_88);
  if (bVar2) {
    local_118 = tmpfile();
    local_129 = local_118 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
               (type *)0xfa93f6);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_128);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                 in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                 (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb80,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                 (int)((ulong)in_stack_fffffffffffffb68 >> 0x20),(char *)in_stack_fffffffffffffb60);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbd0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb50);
      std::__cxx11::string::~string(local_160);
      testing::Message::~Message((Message *)0xfa9547);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa95db);
    local_171 = google::
                HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::write_metadata<_IO_FILE>
                          ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,(_IO_FILE *)local_118);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
               (type *)0xfa9622);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_170);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                 in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                 (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb80,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                 (int)((ulong)in_stack_fffffffffffffb68 >> 0x20),(char *)in_stack_fffffffffffffb60);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbd0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb50);
      std::__cxx11::string::~string(local_1a8);
      testing::Message::~Message((Message *)0xfa96f7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa978b);
    local_1b9 = google::
                HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::write_nopointer_data<_IO_FILE>
                          ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,(_IO_FILE *)local_118);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
               (type *)0xfa97d2);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                 in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                 (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb80,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                 (int)((ulong)in_stack_fffffffffffffb68 >> 0x20),(char *)in_stack_fffffffffffffb60);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbd0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb50);
      std::__cxx11::string::~string(local_1f0);
      testing::Message::~Message((Message *)0xfa98a7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa993e);
    local_1f8 = ftell(local_118);
    rewind(local_118);
    local_210 = 0x18;
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              ((char *)in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               (unsigned_long *)in_stack_fffffffffffffb50);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_208);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb80);
      testing::AssertionResult::failure_message((AssertionResult *)0xfa99f3);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb80,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                 (int)((ulong)in_stack_fffffffffffffb68 >> 0x20),(char *)in_stack_fffffffffffffb60);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbd0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb50);
      testing::Message::~Message((Message *)0xfa9a56);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa9ac7);
    local_250 = fread(local_238,1,local_1f8,local_118);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((char *)in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               (unsigned_long *)in_stack_fffffffffffffb50);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_248);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb80);
      in_stack_fffffffffffffbd0 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xfa9b76);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb80,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                 (int)((ulong)in_stack_fffffffffffffb68 >> 0x20),(char *)in_stack_fffffffffffffb60);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbd0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb50);
      testing::Message::~Message((Message *)0xfa9bd9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa9c4a);
    local_274 = 0xffffffff;
    in_stack_fffffffffffffbcc = fgetc(local_118);
    local_278 = in_stack_fffffffffffffbcc;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60,
               (int *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               (int *)in_stack_fffffffffffffb50);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_270);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb80);
      in_stack_fffffffffffffbc0 =
           testing::AssertionResult::failure_message((AssertionResult *)0xfa9cec);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb80,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                 (int)((ulong)in_stack_fffffffffffffb68 >> 0x20),(char *)in_stack_fffffffffffffb60);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbd0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb50);
      testing::Message::~Message((Message *)0xfa9d49);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa9dba);
    fclose(local_118);
    in_stack_fffffffffffffbb4 = (int)local_238[0];
    in_stack_fffffffffffffbb8 = (char *)std::__cxx11::string::operator[]((ulong)local_e0);
    sVar1 = local_1f8;
    if (in_stack_fffffffffffffbb4 == *in_stack_fffffffffffffbb8) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b8,local_238,sVar1,&local_2b9);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((char *)in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                 in_stack_fffffffffffffb50);
      std::__cxx11::string::~string(local_2b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_298);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb80);
        testing::AssertionResult::failure_message((AssertionResult *)0xfa9f17);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb80,TVar5,
                   (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                   (int)((ulong)in_stack_fffffffffffffb68 >> 0x20),(char *)in_stack_fffffffffffffb60
                  );
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffbd0,
                   (Message *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb50);
        testing::Message::~Message((Message *)0xfa9f74);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfa9fdf);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_300,local_238,sVar1,&local_301);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((char *)in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                 in_stack_fffffffffffffb50);
      std::__cxx11::string::~string(local_300);
      std::allocator<char>::~allocator((allocator<char> *)&local_301);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_2e0);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb80);
        in_stack_fffffffffffffb80 =
             (HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)testing::AssertionResult::failure_message((AssertionResult *)0xfaa0fa);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb80,TVar5,
                   (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                   (int)((ulong)in_stack_fffffffffffffb68 >> 0x20),(char *)in_stack_fffffffffffffb60
                  );
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffbd0,
                   (Message *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb50);
        testing::Message::~Message((Message *)0xfaa157);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfaa1c2);
    }
  }
  iVar4 = (int)((ulong)in_stack_fffffffffffffb68 >> 0x20);
  bVar2 = google::
          HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)&local_88);
  if (bVar2) {
    s = &local_338;
    std::__cxx11::string::string((string *)s);
    StringIO::StringIO(&local_340,s);
    TVar5 = (Type)((ulong)s >> 0x20);
    uVar3 = google::
            BaseHashtableInterface<google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::serialize<google::sparsehash_internal::pod_serializer<int>,StringIO>
                      (&local_88,&local_340);
    local_351 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
               (type *)0xfaa255);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_350);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                 in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                 (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb80,TVar5,
                 (char *)CONCAT17(uVar3,in_stack_fffffffffffffb70),iVar4,
                 (char *)in_stack_fffffffffffffb60);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbd0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb50);
      std::__cxx11::string::~string(local_388);
      testing::Message::~Message((Message *)0xfaa331);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfaa3c8);
    lhs_expression = (char *)std::__cxx11::string::operator[]((ulong)&local_338);
    iVar4 = (int)*lhs_expression;
    rhs_expression = (char *)std::__cxx11::string::operator[]((ulong)local_e0);
    if (iVar4 == *rhs_expression) {
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (lhs_expression,rhs_expression,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar4,in_stack_fffffffffffffb58),in_stack_fffffffffffffb50);
      iVar4 = (int)((ulong)lhs_expression >> 0x20);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_398);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb80);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0xfaa48b);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb80,TVar5,
                   (char *)CONCAT17(uVar3,in_stack_fffffffffffffb70),iVar4,rhs_expression);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffbd0,
                   (Message *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0xfaa4e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfaa553);
    }
    else {
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (lhs_expression,rhs_expression,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar4,in_stack_fffffffffffffb58),in_stack_fffffffffffffb50);
      iVar4 = (int)((ulong)lhs_expression >> 0x20);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_3b8);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb80);
        testing::AssertionResult::failure_message((AssertionResult *)0xfaa5cb);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb80,TVar5,
                   (char *)CONCAT17(uVar3,in_stack_fffffffffffffb70),iVar4,rhs_expression);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffbd0,
                   (Message *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb50);
        testing::Message::~Message((Message *)0xfaa626);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfaa691);
    }
    std::__cxx11::string::~string((string *)&local_338);
  }
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_e0);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xfaa6e7);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, MetadataSerializationAndEndianness) {
  TypeParam ht_out;
  string kExpectedDense(
      "\x13W\x86"
      "B\0\0\0\0\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0",
      24);
  string kExpectedSparse("$hu1\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0", 20);

  if (ht_out.supports_readwrite()) {
    auto fp = tmpfile();
    EXPECT_TRUE(fp != NULL);

    EXPECT_TRUE(ht_out.write_metadata(fp));
    EXPECT_TRUE(ht_out.write_nopointer_data(fp));

    const size_t num_bytes = ftell(fp);
    rewind(fp);
    EXPECT_LE(num_bytes, static_cast<size_t>(24));
    char contents[24];
    EXPECT_EQ(num_bytes, fread(contents, 1, num_bytes, fp));
    EXPECT_EQ(EOF, fgetc(fp));  // check we're *exactly* the right size
    fclose(fp);
    // TODO(csilvers): check type of ht_out instead of looking at the 1st byte.
    if (contents[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, string(contents, num_bytes));
    } else {
      EXPECT_EQ(kExpectedSparse, string(contents, num_bytes));
    }
  }

  // Do it again with new-style serialization.  Here we can use StringIO.
  if (ht_out.supports_serialization()) {
    string stringbuf;
    StringIO stringio(&stringbuf);
    EXPECT_TRUE(
        ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio));
    if (stringbuf[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, stringbuf);
    } else {
      EXPECT_EQ(kExpectedSparse, stringbuf);
    }
  }
}